

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

QUrl __thiscall QTextBrowser::source(QTextBrowser *this)

{
  bool bVar1;
  HistoryEntry *pHVar2;
  QUrlPrivate *in_RDI;
  QTextBrowserPrivate *d;
  
  d_func((QTextBrowser *)0x6de208);
  bVar1 = QList<QTextBrowserPrivate::HistoryEntry>::isEmpty
                    ((QList<QTextBrowserPrivate::HistoryEntry> *)0x6de21e);
  if (bVar1) {
    QUrl::QUrl((QUrl *)in_RDI);
  }
  else {
    pHVar2 = QStack<QTextBrowserPrivate::HistoryEntry>::top
                       ((QStack<QTextBrowserPrivate::HistoryEntry> *)0x6de240);
    QUrl::QUrl((QUrl *)in_RDI,(QUrl *)pHVar2);
  }
  return (QUrl)in_RDI;
}

Assistant:

QUrl QTextBrowser::source() const
{
    Q_D(const QTextBrowser);
    if (d->stack.isEmpty())
        return QUrl();
    else
        return d->stack.top().url;
}